

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool parse_string(cJSON *item,parse_buffer *input_buffer)

{
  uchar *puVar1;
  size_t sVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  cJSON_bool cVar6;
  byte *pbVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  byte *pbVar13;
  byte *pbVar14;
  long lVar15;
  byte *pbVar16;
  bool bVar17;
  
  puVar1 = input_buffer->content;
  sVar2 = input_buffer->offset;
  pbVar13 = puVar1 + sVar2 + 1;
  if (puVar1[sVar2] == '\"') {
    pbVar7 = (byte *)input_buffer->length;
    bVar17 = pbVar13 + -(long)puVar1 < pbVar7;
    pbVar14 = pbVar13;
    if (bVar17) {
      lVar15 = 1;
      lVar8 = 0;
      do {
        if (puVar1[lVar15 + sVar2] == '\\') {
          if (pbVar7 <= (byte *)(lVar15 + sVar2 + 1)) break;
          lVar15 = lVar15 + 1;
          lVar8 = lVar8 + 1;
        }
        else if (puVar1[lVar15 + sVar2] == '\"') {
          if ((bVar17) && (puVar1[lVar15 + sVar2] == '\"')) {
            pbVar7 = (byte *)(*(input_buffer->hooks).allocate)
                                       ((size_t)(pbVar14 + (1 - (long)(puVar1 + lVar8 + sVar2))));
            bVar17 = pbVar7 != (byte *)0x0;
            goto LAB_001201f4;
          }
          break;
        }
        pbVar14 = puVar1 + lVar15 + sVar2 + 1;
        lVar15 = lVar15 + 1;
        bVar17 = pbVar14 + -(long)puVar1 < pbVar7;
      } while (bVar17);
    }
    else {
      lVar15 = 1;
    }
    pbVar7 = (byte *)0x0;
    bVar17 = false;
LAB_001201f4:
    if (bVar17) {
      pbVar16 = pbVar7;
      if (1 < lVar15) {
        do {
          bVar9 = *pbVar13;
          if (bVar9 == 0x5c) {
            if ((long)pbVar14 - (long)pbVar13 < 1) {
LAB_001203ef:
              bVar17 = false;
            }
            else {
              bVar9 = pbVar13[1];
              bVar17 = false;
              if (bVar9 < 0x62) {
                bVar11 = bVar9;
                if (((bVar9 == 0x22) || (bVar9 == 0x2f)) || (bVar9 == 0x5c)) goto LAB_0012029a;
                goto switchD_0012026d_caseD_6f;
              }
              switch(bVar9) {
              case 0x6e:
                bVar11 = 10;
                break;
              case 0x6f:
              case 0x70:
              case 0x71:
              case 0x73:
                goto switchD_0012026d_caseD_6f;
              case 0x72:
                bVar11 = 0xd;
                break;
              case 0x74:
                bVar11 = 9;
                break;
              case 0x75:
                if ((long)pbVar14 - (long)pbVar13 < 6) {
LAB_0012028d:
                  lVar8 = 0;
                }
                else {
                  uVar4 = parse_hex4(pbVar13 + 2);
                  if ((uVar4 & 0xfffffc00) == 0xdc00) {
                    lVar8 = 0;
                  }
                  else {
                    if ((uVar4 & 0xfffffc00) == 0xd800) {
                      if ((((long)pbVar14 - (long)(pbVar13 + 6) < 6) || (pbVar13[6] != 0x5c)) ||
                         (pbVar13[7] != 0x75)) {
                        uVar10 = 0;
                        bVar17 = false;
                      }
                      else {
                        uVar5 = parse_hex4(pbVar13 + 8);
                        bVar17 = 0xfffffbff < uVar5 - 0xe000;
                        if (bVar17) {
                          uVar4 = (uVar4 & 0x3ff) * 0x400 + (uVar5 & 0x3ff) + 0x10000;
                        }
                        else {
                          uVar4 = 0;
                        }
                        uVar10 = (ulong)uVar4;
                      }
                      lVar8 = 0xc;
                      if (!bVar17) goto LAB_0012028d;
                    }
                    else {
                      uVar10 = (ulong)uVar4;
                      lVar8 = 6;
                    }
                    uVar4 = (uint)uVar10;
                    if (uVar4 < 0x80) {
                      uVar5 = 1;
                      bVar9 = 0;
                    }
                    else if (uVar4 < 0x800) {
                      bVar9 = 0xc0;
                      uVar5 = 2;
                    }
                    else if (uVar4 < 0x10000) {
                      bVar9 = 0xe0;
                      uVar5 = 3;
                    }
                    else {
                      if (0x10ffff < uVar4) goto LAB_0012028d;
                      bVar9 = 0xf0;
                      uVar5 = 4;
                    }
                    bVar11 = (char)uVar5 - 1;
                    if (bVar11 != 0) {
                      uVar3 = (ulong)bVar11;
                      do {
                        uVar12 = uVar3 - 1;
                        pbVar16[uVar3] = (byte)uVar10 & 0x3f | 0x80;
                        uVar10 = uVar10 >> 6;
                        uVar3 = uVar12;
                      } while ((char)uVar12 != '\0');
                    }
                    bVar11 = (byte)uVar10 & 0x7f;
                    if (0x7f < uVar4) {
                      bVar11 = (byte)uVar10 | bVar9;
                    }
                    *pbVar16 = bVar11;
                    pbVar16 = pbVar16 + uVar5;
                  }
                }
                if ((char)lVar8 == '\0') goto LAB_001203ef;
                goto LAB_001202a2;
              default:
                bVar11 = 8;
                if (bVar9 != 0x62) {
                  if (bVar9 != 0x66) goto switchD_0012026d_caseD_6f;
                  bVar11 = 0xc;
                }
              }
LAB_0012029a:
              *pbVar16 = bVar11;
              pbVar16 = pbVar16 + 1;
              lVar8 = 2;
LAB_001202a2:
              pbVar13 = pbVar13 + lVar8;
              bVar17 = true;
            }
switchD_0012026d_caseD_6f:
            if (!bVar17) goto LAB_0012045c;
          }
          else {
            pbVar13 = pbVar13 + 1;
            *pbVar16 = bVar9;
            pbVar16 = pbVar16 + 1;
          }
        } while (pbVar13 < puVar1 + lVar15 + sVar2);
      }
      *pbVar16 = 0;
      item->type = 0x10;
      item->valuestring = (char *)pbVar7;
      pbVar14 = pbVar14 + (1 - (long)input_buffer->content);
      cVar6 = 1;
      goto LAB_00120489;
    }
  }
  else {
    pbVar7 = (byte *)0x0;
  }
LAB_0012045c:
  if (pbVar7 != (byte *)0x0) {
    (*(input_buffer->hooks).deallocate)(pbVar7);
  }
  pbVar14 = pbVar13 + -(long)input_buffer->content;
  cVar6 = 0;
LAB_00120489:
  input_buffer->offset = (size_t)pbVar14;
  return cVar6;
}

Assistant:

static cJSON_bool parse_string(cJSON * const item, parse_buffer * const input_buffer)
{
    const unsigned char *input_pointer = buffer_at_offset(input_buffer) + 1;
    const unsigned char *input_end = buffer_at_offset(input_buffer) + 1;
    unsigned char *output_pointer = NULL;
    unsigned char *output = NULL;

    /* not a string */
    if (buffer_at_offset(input_buffer)[0] != '\"')
    {
        goto fail;
    }

    {
        /* calculate approximate size of the output (overestimate) */
        size_t allocation_length = 0;
        size_t skipped_bytes = 0;
        while (((size_t)(input_end - input_buffer->content) < input_buffer->length) && (*input_end != '\"'))
        {
            /* is escape sequence */
            if (input_end[0] == '\\')
            {
                if ((size_t)(input_end + 1 - input_buffer->content) >= input_buffer->length)
                {
                    /* prevent buffer overflow when last input character is a backslash */
                    goto fail;
                }
                skipped_bytes++;
                input_end++;
            }
            input_end++;
        }
        if (((size_t)(input_end - input_buffer->content) >= input_buffer->length) || (*input_end != '\"'))
        {
            goto fail; /* string ended unexpectedly */
        }

        /* This is at most how much we need for the output */
        allocation_length = (size_t) (input_end - buffer_at_offset(input_buffer)) - skipped_bytes;
        output = (unsigned char*)input_buffer->hooks.allocate(allocation_length + sizeof(""));
        if (output == NULL)
        {
            goto fail; /* allocation failure */
        }
    }

    output_pointer = output;
    /* loop through the string literal */
    while (input_pointer < input_end)
    {
        if (*input_pointer != '\\')
        {
            *output_pointer++ = *input_pointer++;
        }
        /* escape sequence */
        else
        {
            unsigned char sequence_length = 2;
            if ((input_end - input_pointer) < 1)
            {
                goto fail;
            }

            switch (input_pointer[1])
            {
                case 'b':
                    *output_pointer++ = '\b';
                    break;
                case 'f':
                    *output_pointer++ = '\f';
                    break;
                case 'n':
                    *output_pointer++ = '\n';
                    break;
                case 'r':
                    *output_pointer++ = '\r';
                    break;
                case 't':
                    *output_pointer++ = '\t';
                    break;
                case '\"':
                case '\\':
                case '/':
                    *output_pointer++ = input_pointer[1];
                    break;

                /* UTF-16 literal */
                case 'u':
                    sequence_length = utf16_literal_to_utf8(input_pointer, input_end, &output_pointer);
                    if (sequence_length == 0)
                    {
                        /* failed to convert UTF16-literal to UTF-8 */
                        goto fail;
                    }
                    break;

                default:
                    goto fail;
            }
            input_pointer += sequence_length;
        }
    }

    /* zero terminate the output */
    *output_pointer = '\0';

    item->type = cJSON_String;
    item->valuestring = (char*)output;

    input_buffer->offset = (size_t) (input_end - input_buffer->content);
    input_buffer->offset++;

    return true;

fail:
    if (output != NULL)
    {
        input_buffer->hooks.deallocate(output);
    }

    if (input_pointer != NULL)
    {
        input_buffer->offset = (size_t)(input_pointer - input_buffer->content);
    }

    return false;
}